

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kliveness.c
# Opt level: O0

Vec_Ptr_t * getVecOfVecFairness(FILE *fp)

{
  Vec_Ptr_t *pVVar1;
  char *pcVar2;
  char local_88 [8];
  char stringBuffer [100];
  Vec_Ptr_t *masterVector;
  FILE *fp_local;
  
  pVVar1 = Vec_PtrAlloc(0);
  while (pcVar2 = fgets(local_88,0x32,(FILE *)fp), pcVar2 != (char *)0x0) {
    strstr(local_88,":");
  }
  return pVVar1;
}

Assistant:

Vec_Ptr_t *getVecOfVecFairness(FILE *fp)
{
	Vec_Ptr_t *masterVector = Vec_PtrAlloc(0);
	//Vec_Ptr_t *currSignalVector;
	char stringBuffer[100];
	//int i;
	
	while(fgets(stringBuffer, 50, fp))
	{
		if(strstr(stringBuffer, ":"))
		{

		}
		else
		{
				
		}
	}

	return masterVector;
}